

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O1

void __thiscall capnp::EzRpcClient::Impl::Impl(Impl *this,int socketFd,ReaderOptions readerOpts)

{
  LowLevelAsyncIoProvider *pLVar1;
  AsyncIoStream *pAVar2;
  Own<capnp::EzRpcClient::Impl::ClientContext> OVar3;
  Own<kj::AsyncIoStream> local_48;
  Disposer *local_38;
  ClientContext *pCStack_30;
  ReaderOptions local_28;
  
  local_28.traversalLimitInWords = readerOpts.traversalLimitInWords;
  local_28.nestingLimit = readerOpts.nestingLimit;
  EzRpcContext::getThreadLocal();
  kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_38);
  local_48.disposer = local_38;
  local_48.ptr = (AsyncIoStream *)pCStack_30;
  kj::Promise<void>::fork((Promise<void> *)&this->setupPromise);
  pAVar2 = local_48.ptr;
  if ((ClientContext *)local_48.ptr != (ClientContext *)0x0) {
    local_48.ptr = (AsyncIoStream *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,
               (long)(((Own<kj::AsyncIoStream> *)&pAVar2->super_AsyncInputStream)->disposer[-2].
                      _vptr_Disposer + -6) +
               (long)((((TwoPartyVatNetwork *)((long)pAVar2 + 0x10))->peerVatId).
                      super_MessageBuilder.arenaSpace + -1));
  }
  pLVar1 = (((this->context).ptr)->ioContext).lowLevelProvider.ptr;
  (*pLVar1->_vptr_LowLevelAsyncIoProvider[2])(&local_48,pLVar1,socketFd,0);
  OVar3 = kj::
          heap<capnp::EzRpcClient::Impl::ClientContext,kj::Own<kj::AsyncIoStream>,capnp::ReaderOptions&>
                    ((kj *)&local_38,&local_48,&local_28);
  pAVar2 = local_48.ptr;
  (this->clientContext).ptr.disposer = local_38;
  (this->clientContext).ptr.ptr = pCStack_30;
  pCStack_30 = (ClientContext *)0x0;
  if ((ClientContext *)local_48.ptr != (ClientContext *)0x0) {
    local_48.ptr = (AsyncIoStream *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,
               (long)(((Own<kj::AsyncIoStream> *)&pAVar2->super_AsyncInputStream)->disposer[-2].
                      _vptr_Disposer + -6) +
               (long)((((TwoPartyVatNetwork *)((long)pAVar2 + 0x10))->peerVatId).
                      super_MessageBuilder.arenaSpace + -1),OVar3.ptr);
  }
  return;
}

Assistant:

Impl(int socketFd, ReaderOptions readerOpts)
      : context(EzRpcContext::getThreadLocal()),
        setupPromise(kj::Promise<void>(kj::READY_NOW).fork()),
        clientContext(kj::heap<ClientContext>(
            context->getLowLevelIoProvider().wrapSocketFd(socketFd),
            readerOpts)) {}